

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void InitializeForwardRealFFT(int fft_size,ForwardRealFFT *forward_real_fft)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  double *pdVar4;
  fft_complex *padVar5;
  fft_plan local_60;
  ForwardRealFFT *local_18;
  ForwardRealFFT *forward_real_fft_local;
  int fft_size_local;
  
  forward_real_fft->fft_size = fft_size;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)fft_size;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  local_18 = forward_real_fft;
  forward_real_fft_local._4_4_ = fft_size;
  pdVar4 = (double *)operator_new__(uVar3);
  local_18->waveform = pdVar4;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)forward_real_fft_local._4_4_;
  uVar3 = SUB168(auVar2 * ZEXT816(0x10),0);
  if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  padVar5 = (fft_complex *)operator_new__(uVar3);
  local_18->spectrum = padVar5;
  fft_plan_dft_r2c_1d(&local_60,forward_real_fft_local._4_4_,local_18->waveform,local_18->spectrum,3
                     );
  memcpy(&local_18->forward_fft,&local_60,0x48);
  return;
}

Assistant:

void InitializeForwardRealFFT(int fft_size, ForwardRealFFT *forward_real_fft) {
  forward_real_fft->fft_size = fft_size;
  forward_real_fft->waveform = new double[fft_size];
  forward_real_fft->spectrum = new fft_complex[fft_size];
  forward_real_fft->forward_fft = fft_plan_dft_r2c_1d(fft_size,
      forward_real_fft->waveform, forward_real_fft->spectrum, FFT_ESTIMATE);
}